

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::getComponent<tcu::Vector<float,3>>
          (Functions *this,ExprP<tcu::Vector<float,_3>_> *container,int ndx)

{
  deInt32 *pdVar1;
  Expr<int> *ptr;
  Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_3>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *func;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  ExprP<float> EVar3;
  ExprP<int> local_28;
  SharedPtrStateBase *pSVar2;
  
  ptr = (Expr<int> *)operator_new(0x10);
  (ptr->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00b3d280;
  *(int *)&ptr[1].super_ExprBase._vptr_ExprBase = ndx;
  exprP<int>((BuiltinPrecisionTests *)&local_28,ptr);
  voidP();
  voidP();
  func = (Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_3>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *)instance<deqp::gls::BuiltinPrecisionTests::Functions::GetComponent<tcu::Vector<float,3>>>
                      ();
  EVar3 = createApply<deqp::gls::BuiltinPrecisionTests::Signature<float,tcu::Vector<float,3>,int,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
                    ((BuiltinPrecisionTests *)this,func,container,&local_28,&voidP::singleton,
                     &voidP::singleton);
  pSVar2 = EVar3.super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state;
  if (local_28.super_ExprPBase<int>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_28.super_ExprPBase<int>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_28.super_ExprPBase<int>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_>.m_ptr = (Expr<int> *)0x0;
      (*(local_28.super_ExprPBase<int>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar2 = extraout_RDX;
    }
    LOCK();
    pdVar1 = &(local_28.super_ExprPBase<int>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_28.super_ExprPBase<int>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_28.super_ExprPBase<int>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
      pSVar2 = extraout_RDX_00;
    }
  }
  EVar3.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = pSVar2;
  EVar3.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar3.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

ExprP<typename T::Element> getComponent (const ExprP<T>& container, int ndx)
{
	DE_ASSERT(0 <= ndx && ndx < T::SIZE);
	return app<GetComponent<T> >(container, constant(ndx));
}